

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O0

void __thiscall Assimp::LWO::AnimResolver::ClearAnimRangeSetup(AnimResolver *this)

{
  bool bVar1;
  reference pEVar2;
  reference pEVar3;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_80;
  const_iterator local_78;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_70;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_68;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_60;
  const_iterator local_58;
  Key *local_50;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_48;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_40;
  const_iterator local_38;
  __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
  local_30;
  const_iterator local_28;
  _Self local_20;
  _Self local_18;
  iterator it;
  AnimResolver *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::begin
                 (this->envelopes);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::end
                   (this->envelopes);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    pEVar2 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    local_30._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                          (&pEVar3->keys);
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
    ::__normal_iterator<Assimp::LWO::Key*>
              ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
                *)&local_28,&local_30);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    local_48._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                          (&pEVar3->keys);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    local_40 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator+(&local_48,pEVar3->old_first);
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
    ::__normal_iterator<Assimp::LWO::Key*>
              ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
                *)&local_38,&local_40);
    local_50 = (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::erase
                                (&pEVar2->keys,local_28,local_38);
    pEVar2 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    local_70._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::begin
                          (&pEVar3->keys);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    local_68 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator+(&local_70,pEVar3->old_last);
    local_60 = __gnu_cxx::
               __normal_iterator<Assimp::LWO::Key_*,_std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>_>
               ::operator+(&local_68,1);
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
    ::__normal_iterator<Assimp::LWO::Key*>
              ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
                *)&local_58,&local_60);
    pEVar3 = std::_List_iterator<Assimp::LWO::Envelope>::operator*(&local_18);
    local_80._M_current =
         (Key *)std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::end(&pEVar3->keys)
    ;
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
    ::__normal_iterator<Assimp::LWO::Key*>
              ((__normal_iterator<Assimp::LWO::Key_const*,std::vector<Assimp::LWO::Key,std::allocator<Assimp::LWO::Key>>>
                *)&local_78,&local_80);
    std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::erase
              (&pEVar2->keys,local_58,local_78);
    std::_List_iterator<Assimp::LWO::Envelope>::operator++(&local_18);
  }
  return;
}

Assistant:

void AnimResolver::ClearAnimRangeSetup()
{
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).keys.erase((*it).keys.begin(),(*it).keys.begin()+(*it).old_first);
        (*it).keys.erase((*it).keys.begin()+(*it).old_last+1,(*it).keys.end());
    }
}